

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc.cc
# Opt level: O1

void gutil::trim(string *s)

{
  size_type sVar1;
  pointer pcVar2;
  ulong uVar3;
  int iVar4;
  size_type sVar5;
  size_type sVar6;
  ulong uVar7;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  sVar1 = s->_M_string_length;
  if (sVar1 == 0) {
    sVar6 = 0;
  }
  else {
    pcVar2 = (s->_M_dataplus)._M_p;
    sVar5 = 0;
    do {
      iVar4 = isspace((int)pcVar2[sVar5]);
      sVar6 = sVar5;
      if (iVar4 == 0) break;
      sVar5 = sVar5 + 1;
      sVar6 = sVar1;
    } while (sVar1 != sVar5);
  }
  if (sVar6 != 0) {
    std::__cxx11::string::substr((ulong)local_40,(ulong)s);
    std::__cxx11::string::operator=((string *)s,(string *)local_40);
    if (local_40[0] != local_30) {
      operator_delete(local_40[0]);
    }
  }
  pcVar2 = (s->_M_dataplus)._M_p;
  uVar3 = s->_M_string_length;
  uVar7 = uVar3 + 1;
  do {
    if (uVar7 == 1) {
      uVar7 = 0;
      break;
    }
    iVar4 = isspace((int)pcVar2[uVar7 - 2]);
    uVar7 = uVar7 - 1;
  } while (iVar4 != 0);
  if (uVar7 < uVar3) {
    std::__cxx11::string::substr((ulong)local_40,(ulong)s);
    std::__cxx11::string::operator=((string *)s,(string *)local_40);
    if (local_40[0] != local_30) {
      operator_delete(local_40[0]);
    }
  }
  return;
}

Assistant:

void gutil::trim(std::string &s)
{
  size_t pos;

  pos=0;

  while (pos < s.size() && isspace(s[pos]))
  {
    pos++;
  }

  if (pos > 0)
  {
    s=s.substr(pos);
  }

  pos=s.size();

  while (pos > 0 && isspace(s[pos-1]))
  {
    pos--;
  }

  if (pos < s.size())
  {
    s=s.substr(0, pos);
  }
}